

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_uuid.cpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::uuid_rule::string_value(uuid_rule *this,string *v)

{
  uuid *puVar1;
  undefined8 uVar2;
  maybe<pstore::uuid,_void> *pmVar3;
  uuid *puVar4;
  error_category *extraout_RDX;
  error_code eVar5;
  maybe<pstore::uuid,_void> value;
  
  pmVar3 = uuid::from_string(&value,v);
  eVar5._M_cat = extraout_RDX;
  eVar5._0_8_ = pmVar3;
  if (value.valid_ == true) {
    puVar4 = maybe<pstore::uuid,_void>::operator->(&value);
    puVar1 = (this->v_).ptr_;
    uVar2 = *(undefined8 *)((puVar4->data_)._M_elems + 8);
    *(undefined8 *)(puVar1->data_)._M_elems = *(undefined8 *)(puVar4->data_)._M_elems;
    *(undefined8 *)((puVar1->data_)._M_elems + 8) = uVar2;
    eVar5 = rule::pop(&this->super_rule);
  }
  if (value.valid_ == false) {
    eVar5 = make_error_code(bad_uuid);
  }
  return eVar5;
}

Assistant:

std::error_code uuid_rule::string_value (std::string const & v) {
                if (maybe<uuid> const value = uuid::from_string (v)) {
                    *v_ = *value;
                    return pop ();
                }
                return error::bad_uuid;
            }